

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkInterfaceLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget,bool usage_requirements_only)

{
  TargetType TVar1;
  cmLocalGenerator *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  int iVar5;
  char *pcVar6;
  char *__s1;
  ostream *poVar7;
  cmLinkImplementationLibraries *r;
  PolicyID id;
  PolicyID id_00;
  string oldLibraries;
  string linkIfaceProp;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> ifaceLibs;
  string local_208;
  string newLibraries;
  string suffix;
  ostringstream w;
  
  std::__cxx11::string::string((string *)&suffix,"_",(allocator *)&w);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&suffix);
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&w,config);
    std::__cxx11::string::append((string *)&suffix);
    std::__cxx11::string::~string((string *)&w);
  }
  linkIfaceProp._M_dataplus._M_p = (pointer)&linkIfaceProp.field_2;
  linkIfaceProp._M_string_length = 0;
  linkIfaceProp.field_2._M_local_buf[0] = '\0';
  PVar4 = GetPolicyStatusCMP0022(this);
  if ((PVar4 == OLD) || (PVar4 = GetPolicyStatusCMP0022(this), PVar4 == WARN)) {
    if ((this->Target->TargetTypeValue != SHARED_LIBRARY) &&
       (bVar3 = IsExecutableWithExports(this), !bVar3)) goto LAB_003b9d34;
    std::__cxx11::string::assign((char *)&linkIfaceProp);
    std::__cxx11::string::append((string *)&linkIfaceProp);
    pcVar6 = GetProperty(this,&linkIfaceProp);
    if (pcVar6 == (char *)0x0) goto LAB_003b9b0a;
  }
  else {
LAB_003b9b0a:
    std::__cxx11::string::assign((char *)&linkIfaceProp);
    pcVar6 = GetProperty(this,&linkIfaceProp);
    if (pcVar6 == (char *)0x0) {
LAB_003b9d34:
      TVar1 = this->Target->TargetTypeValue;
      if ((TVar1 != EXECUTABLE) && (TVar1 != MODULE_LIBRARY)) {
        (iface->super_cmLinkInterface).field_0x6b = 1;
        iface->ExplicitLibraries = (char *)0x0;
        PVar4 = GetPolicyStatusCMP0022(this);
        if ((PVar4 == WARN) || (PVar4 = GetPolicyStatusCMP0022(this), PVar4 == OLD)) {
          r = GetLinkImplementationLibrariesInternal(this,config,headTarget);
          std::vector<cmLinkItem,std::allocator<cmLinkItem>>::
          insert<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>,void>
                    ((vector<cmLinkItem,std::allocator<cmLinkItem>> *)iface,
                     (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (r->Libraries).
                     super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (r->Libraries).
                     super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          PVar4 = GetPolicyStatusCMP0022(this);
          if ((PVar4 == WARN) && (!usage_requirements_only && this->PolicyWarnedCMP0022 == false)) {
            ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            if ((ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                 ::newProp_abi_cxx11_ == '\0') &&
               (iVar5 = __cxa_guard_acquire(&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                                             ::newProp_abi_cxx11_), iVar5 != 0)) {
              std::__cxx11::string::string
                        ((string *)
                         &ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                          ::newProp_abi_cxx11_,"INTERFACE_LINK_LIBRARIES",(allocator *)&w);
              __cxa_atexit(std::__cxx11::string::~string,
                           &ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                            ::newProp_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                                   ::newProp_abi_cxx11_);
            }
            pcVar6 = GetProperty(this,&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                                       ::newProp_abi_cxx11_);
            if (pcVar6 != (char *)0x0) {
              std::__cxx11::string::string((string *)&w,pcVar6,(allocator *)&newLibraries);
              ExpandLinkItems(this,&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                                    ::newProp_abi_cxx11_,(string *)&w,config,headTarget,false,
                              &ifaceLibs,(bool *)&oldLibraries);
              std::__cxx11::string::~string((string *)&w);
            }
            bVar3 = std::operator!=(&ifaceLibs,
                                    (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
            if (bVar3) {
              cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
                        (&oldLibraries,&r->Libraries,";");
              cmJoin<std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                        (&newLibraries,&ifaceLibs,";");
              if (oldLibraries._M_string_length == 0) {
                std::__cxx11::string::assign((char *)&oldLibraries);
              }
              if (newLibraries._M_string_length == 0) {
                std::__cxx11::string::assign((char *)&newLibraries);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_208,(cmPolicies *)0x16,id_00);
              poVar7 = std::operator<<((ostream *)&w,(string *)&local_208);
              poVar7 = std::operator<<(poVar7,"\nTarget \"");
              poVar7 = std::operator<<(poVar7,(string *)&this->Target->Name);
              poVar7 = std::operator<<(poVar7,
                                       "\" has an INTERFACE_LINK_LIBRARIES property.  This should be preferred as the source of the link interface for this library but because CMP0022 is not set CMake is ignoring the property and using the link implementation as the link interface instead.\nINTERFACE_LINK_LIBRARIES:\n  "
                                      );
              poVar7 = std::operator<<(poVar7,(string *)&newLibraries);
              poVar7 = std::operator<<(poVar7,"\nLink implementation:\n  ");
              poVar7 = std::operator<<(poVar7,(string *)&oldLibraries);
              std::operator<<(poVar7,"\n");
              std::__cxx11::string::~string((string *)&local_208);
              pcVar2 = this->LocalGenerator;
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(pcVar2,AUTHOR_WARNING,&local_208);
              std::__cxx11::string::~string((string *)&local_208);
              this->PolicyWarnedCMP0022 = true;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
              std::__cxx11::string::~string((string *)&newLibraries);
              std::__cxx11::string::~string((string *)&oldLibraries);
            }
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&ifaceLibs);
          }
        }
      }
      goto LAB_003b9d0b;
    }
  }
  PVar4 = GetPolicyStatusCMP0022(this);
  if ((PVar4 == WARN) && (this->PolicyWarnedCMP0022 == false)) {
    std::__cxx11::string::string((string *)&w,"INTERFACE_LINK_LIBRARIES",(allocator *)&oldLibraries)
    ;
    __s1 = GetProperty(this,(string *)&w);
    std::__cxx11::string::~string((string *)&w);
    if ((__s1 != (char *)0x0) && (iVar5 = strcmp(__s1,pcVar6), iVar5 != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&oldLibraries,(cmPolicies *)0x16,id);
      poVar7 = std::operator<<((ostream *)&w,(string *)&oldLibraries);
      poVar7 = std::operator<<(poVar7,"\nTarget \"");
      poVar7 = std::operator<<(poVar7,(string *)&this->Target->Name);
      poVar7 = std::operator<<(poVar7,
                               "\" has an INTERFACE_LINK_LIBRARIES property which differs from its "
                              );
      poVar7 = std::operator<<(poVar7,(string *)&linkIfaceProp);
      poVar7 = std::operator<<(poVar7," properties.\nINTERFACE_LINK_LIBRARIES:\n  ");
      poVar7 = std::operator<<(poVar7,__s1);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,(string *)&linkIfaceProp);
      poVar7 = std::operator<<(poVar7,":\n  ");
      poVar7 = std::operator<<(poVar7,pcVar6);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string((string *)&oldLibraries);
      pcVar2 = this->LocalGenerator;
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(pcVar2,AUTHOR_WARNING,&oldLibraries);
      std::__cxx11::string::~string((string *)&oldLibraries);
      this->PolicyWarnedCMP0022 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
    }
  }
  (iface->super_cmLinkInterface).field_0x6b = 1;
  iface->ExplicitLibraries = pcVar6;
  std::__cxx11::string::string((string *)&w,pcVar6,(allocator *)&oldLibraries);
  ExpandLinkItems(this,&linkIfaceProp,(string *)&w,config,headTarget,usage_requirements_only,
                  (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface,
                  (bool *)&(iface->super_cmLinkInterface).field_0x6c);
  std::__cxx11::string::~string((string *)&w);
LAB_003b9d0b:
  std::__cxx11::string::~string((string *)&linkIfaceProp);
  std::__cxx11::string::~string((string *)&suffix);
  return;
}

Assistant:

void
cmGeneratorTarget::ComputeLinkInterfaceLibraries(
  const std::string& config,
  cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget,
  bool usage_requirements_only) const
{
  // Construct the property name suffix for this configuration.
  std::string suffix = "_";
  if(!config.empty())
    {
    suffix += cmSystemTools::UpperCase(config);
    }
  else
    {
    suffix += "NOCONFIG";
    }

  // An explicit list of interface libraries may be set for shared
  // libraries and executables that export symbols.
  const char* explicitLibraries = 0;
  std::string linkIfaceProp;
  if(this->GetPolicyStatusCMP0022() != cmPolicies::OLD &&
     this->GetPolicyStatusCMP0022() != cmPolicies::WARN)
    {
    // CMP0022 NEW behavior is to use INTERFACE_LINK_LIBRARIES.
    linkIfaceProp = "INTERFACE_LINK_LIBRARIES";
    explicitLibraries = this->GetProperty(linkIfaceProp);
    }
  else if(this->GetType() == cmState::SHARED_LIBRARY ||
          this->IsExecutableWithExports())
    {
    // CMP0022 OLD behavior is to use LINK_INTERFACE_LIBRARIES if set on a
    // shared lib or executable.

    // Lookup the per-configuration property.
    linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
    linkIfaceProp += suffix;
    explicitLibraries = this->GetProperty(linkIfaceProp);

    // If not set, try the generic property.
    if(!explicitLibraries)
      {
      linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
      explicitLibraries = this->GetProperty(linkIfaceProp);
      }
    }

  if(explicitLibraries &&
     this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
     !this->PolicyWarnedCMP0022)
    {
    // Compare the explicitly set old link interface properties to the
    // preferred new link interface property one and warn if different.
    const char* newExplicitLibraries =
      this->GetProperty("INTERFACE_LINK_LIBRARIES");
    if (newExplicitLibraries
        && strcmp(newExplicitLibraries, explicitLibraries) != 0)
      {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
        "Target \"" << this->GetName() << "\" has an "
        "INTERFACE_LINK_LIBRARIES property which differs from its " <<
        linkIfaceProp << " properties."
        "\n"
        "INTERFACE_LINK_LIBRARIES:\n"
        "  " << newExplicitLibraries << "\n" <<
        linkIfaceProp << ":\n"
        "  " << (explicitLibraries ? explicitLibraries : "(empty)") << "\n";
      this->LocalGenerator->IssueMessage(cmake::AUTHOR_WARNING, w.str());
      this->PolicyWarnedCMP0022 = true;
      }
    }

  // There is no implicit link interface for executables or modules
  // so if none was explicitly set then there is no link interface.
  if(!explicitLibraries &&
     (this->GetType() == cmState::EXECUTABLE ||
      (this->GetType() == cmState::MODULE_LIBRARY)))
    {
    return;
    }
  iface.Exists = true;
  iface.ExplicitLibraries = explicitLibraries;

  if(explicitLibraries)
    {
    // The interface libraries have been explicitly set.
    this->ExpandLinkItems(linkIfaceProp, explicitLibraries,
                                  config,
                                headTarget, usage_requirements_only,
                                iface.Libraries,
                                iface.HadHeadSensitiveCondition);
    }
  else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN
        || this->GetPolicyStatusCMP0022() == cmPolicies::OLD)
    // If CMP0022 is NEW then the plain tll signature sets the
    // INTERFACE_LINK_LIBRARIES, so if we get here then the project
    // cleared the property explicitly and we should not fall back
    // to the link implementation.
    {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibrariesInternal(config, headTarget);
    iface.Libraries.insert(iface.Libraries.end(),
                           impl->Libraries.begin(), impl->Libraries.end());
    if(this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
       !this->PolicyWarnedCMP0022 && !usage_requirements_only)
      {
      // Compare the link implementation fallback link interface to the
      // preferred new link interface property and warn if different.
      std::vector<cmLinkItem> ifaceLibs;
      static const std::string newProp = "INTERFACE_LINK_LIBRARIES";
      if(const char* newExplicitLibraries = this->GetProperty(newProp))
        {
        bool hadHeadSensitiveConditionDummy = false;
        this->ExpandLinkItems(newProp, newExplicitLibraries, config,
                              headTarget,
                              usage_requirements_only,
                              ifaceLibs, hadHeadSensitiveConditionDummy);
        }
      if (ifaceLibs != iface.Libraries)
        {
        std::string oldLibraries = cmJoin(impl->Libraries, ";");
        std::string newLibraries = cmJoin(ifaceLibs, ";");
        if(oldLibraries.empty())
          { oldLibraries = "(empty)"; }
        if(newLibraries.empty())
          { newLibraries = "(empty)"; }

        std::ostringstream w;
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << this->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property.  "
          "This should be preferred as the source of the link interface "
          "for this library but because CMP0022 is not set CMake is "
          "ignoring the property and using the link implementation "
          "as the link interface instead."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << newLibraries << "\n"
          "Link implementation:\n"
          "  " << oldLibraries << "\n";
        this->LocalGenerator->IssueMessage(cmake::AUTHOR_WARNING, w.str());
        this->PolicyWarnedCMP0022 = true;
        }
      }
    }
}